

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O1

bool __thiscall leveldb::MemTable::Get(MemTable *this,LookupKey *key,string *value,Status *s)

{
  char cVar1;
  char *p;
  int iVar2;
  Node *pNVar3;
  char *pcVar4;
  Slice SVar5;
  uint32_t key_length;
  uint local_54;
  Status local_50;
  Slice local_48;
  Slice local_38;
  
  local_48.data_ = key->start_;
  pcVar4 = (char *)0x0;
  pNVar3 = SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::FindGreaterOrEqual
                     (&this->table_,&local_48.data_,(Node **)0x0);
  if (pNVar3 == (Node *)0x0) goto LAB_00110439;
  p = pNVar3->key;
  cVar1 = *p;
  if (-1 < cVar1) {
    pcVar4 = p + 1;
    local_54 = (int)cVar1;
  }
  if (cVar1 < '\0') {
    pcVar4 = GetVarint32PtrFallback(p,p + 5,&local_54);
  }
  local_48.size_ = (size_t)(local_54 - 8);
  local_38.data_ = key->kstart_;
  local_38.size_ = (size_t)(key->end_ + (-8 - (long)local_38.data_));
  local_48.data_ = pcVar4;
  iVar2 = (*((this->comparator_).comparator.user_comparator_)->_vptr_Comparator[2])();
  if (iVar2 == 0) {
    if (pcVar4[(ulong)local_54 - 8] == '\0') {
      local_48.data_ = "";
      local_48.size_ = 0;
      local_38.data_ = "";
      local_38.size_ = 0;
      Status::Status(&local_50,kNotFound,&local_48,&local_38);
      pcVar4 = s->state_;
      if (pcVar4 != local_50.state_) {
        if (pcVar4 != (char *)0x0) {
          operator_delete__(pcVar4);
        }
        if (local_50.state_ == (char *)0x0) {
          pcVar4 = (char *)0x0;
        }
        else {
          pcVar4 = Status::CopyState(local_50.state_);
        }
        s->state_ = pcVar4;
      }
      if (local_50.state_ != (char *)0x0) {
        operator_delete__(local_50.state_);
      }
    }
    else {
      if (pcVar4[(ulong)local_54 - 8] != '\x01') goto LAB_00110390;
      SVar5 = GetLengthPrefixedSlice(pcVar4 + local_54);
      std::__cxx11::string::_M_replace
                ((ulong)value,0,(char *)value->_M_string_length,(ulong)SVar5.data_);
    }
    pcVar4 = (char *)0x1;
  }
  else {
LAB_00110390:
    pcVar4 = (char *)0x0;
  }
LAB_00110439:
  return SUB81(pcVar4,0);
}

Assistant:

bool MemTable::Get(const LookupKey &key, std::string *value, Status *s) {
        Slice memkey = key.memtable_key();
        Table::Iterator iter(&table_);
        iter.Seek(memkey.data());
        if (iter.Valid()) {
            // entry format is:
            //    klength  varint32
            //    userkey  char[klength]
            //    tag      uint64
            //    vlength  varint32
            //    value    char[vlength]
            // Check that it belongs to same user key.  We do not check the
            // sequence number since the Seek() call above should have skipped
            // all entries with overly large sequence numbers.
            const char *entry = iter.key();
            uint32_t key_length;
            const char *key_ptr = GetVarint32Ptr(entry, entry + 5, &key_length);
            if (comparator_.comparator.user_comparator()->Compare(
                    Slice(key_ptr, key_length - 8),
                    key.user_key()) == 0) {
                // Correct user key
                const uint64_t tag = DecodeFixed64(key_ptr + key_length - 8);
                switch (static_cast<ValueType>(tag & 0xff)) {
                    case kTypeValue: {
                        Slice v = GetLengthPrefixedSlice(key_ptr + key_length);
                        value->assign(v.data(), v.size());
                        return true;
                    }
                    case kTypeDeletion:
                        *s = Status::NotFound(Slice());
                        return true;
                }
            }
        }
        return false;
    }